

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  unsigned_long *puVar12;
  ulong *puVar13;
  unsigned_long uVar14;
  size_t *key;
  ulong *key_00;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar17;
  longdouble in_ST3;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar21;
  tuple<> local_121;
  longdouble local_120;
  longdouble local_110;
  longdouble local_104;
  longdouble local_f8;
  longdouble local_ec;
  longdouble local_e0;
  longdouble local_d0;
  longdouble local_c4;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_b8;
  unsigned_long local_b0;
  size_t *local_a8;
  size_t local_a0;
  double *local_98;
  longdouble local_8c;
  size_t local_80;
  unsigned_long local_78;
  size_t *local_70;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  size_t local_48;
  double local_38;
  
  local_b0 = Xc_indptr[col_num + 1];
  local_120 = (longdouble)CONCAT28(local_120._8_2_,Xc_indptr[col_num]);
  if (end < st || Xc_indptr[col_num] == local_b0) {
    return -INFINITY;
  }
  local_e0 = (longdouble)CONCAT28(local_e0._8_2_,Xc_ind);
  key = ix_arr + st;
  local_ec = (longdouble)0;
  local_a8 = ix_arr;
  local_98 = Xc;
  local_80 = st;
  local_48 = col_num;
  do {
    local_b8._M_head_impl = key;
    pVar21 = tsl::detail_robin_hash::
             robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
             ::
             insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                       ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                        (tuple<const_unsigned_long_&> *)&local_b8,&local_121);
    uVar3 = local_b0;
    local_ec = local_ec + (longdouble)*(double *)((pVar21.first.m_bucket.m_bucket)->m_value + 8);
    st = st + 1;
    key = key + 1;
  } while (st <= end);
  local_f8 = (longdouble)0;
  if (local_ec <= local_f8) {
    return -INFINITY;
  }
  key_00 = local_a8 + local_80;
  puVar7 = local_a8 + end + 1;
  uVar5 = (long)puVar7 - (long)key_00 >> 3;
  puVar2 = local_e0._0_8_;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar8 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key_00[uVar6] < local_e0._0_8_[local_120._0_8_]) {
        key_00 = key_00 + uVar6 + 1;
        uVar5 = uVar8;
      }
    } while (0 < (long)uVar5);
  }
  local_78 = local_b0 - 1;
  uVar5 = local_e0._0_8_[local_b0 - 1];
  local_70 = local_a8 + end;
  puVar12 = local_e0._0_8_;
  local_a0 = end;
  if (missing_action == Fail) {
    if (key_00 == puVar7) {
      return -INFINITY;
    }
    local_f8 = (longdouble)0;
    uVar11 = local_b0;
    uVar14 = local_120._0_8_;
    local_120 = local_f8;
    lVar15 = local_ec;
    lVar19 = in_ST3;
    local_d0 = local_f8;
    local_c4 = local_f8;
    while (uVar6 = *key_00, uVar6 <= uVar5) {
      puVar1 = puVar12 + uVar14;
      uVar8 = *puVar1;
      if (uVar8 == uVar6) {
        local_b8._M_head_impl = key_00;
        pVar21 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_b8,&local_121);
        local_110 = (longdouble)*(double *)((pVar21.first.m_bucket.m_bucket)->m_value + 8);
        local_8c = (longdouble)local_98[uVar14];
        local_104 = local_8c * local_8c;
        lVar17 = lVar19;
        lVar16 = lVar19;
        lVar20 = lVar19;
        fmal();
        local_f8 = in_ST0;
        fmal();
        in_ST0 = lVar19;
        lVar19 = lVar20;
        local_120 = in_ST1;
        fmal();
        local_d0 = in_ST2;
        fmal();
        puVar12 = local_e0._0_8_;
        lVar15 = local_ec;
        local_c4 = in_ST3;
        if ((key_00 == local_70) || (uVar14 == local_78)) break;
        puVar13 = puVar1 + 1;
        key_00 = key_00 + 1;
        uVar6 = (long)((long)puVar2 + (uVar3 * 8 - (long)puVar13)) >> 3;
        uVar11 = local_b0;
        if (0 < (long)uVar6) {
          do {
            uVar8 = uVar6 >> 1;
            uVar9 = ~uVar8 + uVar6;
            uVar6 = uVar8;
            if (puVar13[uVar8] < *key_00) {
              puVar13 = puVar13 + uVar8 + 1;
              uVar6 = uVar9;
            }
          } while (0 < (long)uVar6);
        }
LAB_0013346e:
        uVar14 = (long)puVar13 - (long)puVar12 >> 3;
        in_ST1 = lVar17;
        in_ST2 = lVar16;
        in_ST3 = lVar20;
      }
      else {
        if (uVar8 <= uVar6) {
          puVar13 = puVar1 + 1;
          uVar8 = (long)((long)puVar2 + (uVar3 * 8 - (long)(puVar1 + 1))) >> 3;
          while (lVar17 = in_ST1, lVar16 = in_ST2, lVar20 = in_ST3, 0 < (long)uVar8) {
            uVar9 = uVar8 >> 1;
            uVar10 = ~uVar9 + uVar8;
            uVar8 = uVar9;
            if (puVar13[uVar9] < uVar6) {
              puVar13 = puVar13 + uVar9 + 1;
              uVar8 = uVar10;
            }
          }
          goto LAB_0013346e;
        }
        key_00 = key_00 + 1;
        uVar6 = (long)puVar7 - (long)key_00 >> 3;
        while (0 < (long)uVar6) {
          uVar9 = uVar6 >> 1;
          uVar10 = ~uVar9 + uVar6;
          uVar6 = uVar9;
          if (key_00[uVar9] < uVar8) {
            key_00 = key_00 + uVar9 + 1;
            uVar6 = uVar10;
          }
        }
      }
      if ((key_00 == puVar7) || (uVar14 == uVar11)) break;
    }
  }
  else {
    lVar15 = local_f8;
    local_d0 = local_f8;
    local_c4 = local_f8;
    if (key_00 != puVar7) {
      local_f8 = (longdouble)0;
      uVar11 = local_b0;
      uVar14 = local_120._0_8_;
      local_120 = local_f8;
      lVar19 = in_ST3;
      local_d0 = local_f8;
      local_c4 = local_f8;
      while (uVar6 = *key_00, lVar15 = local_120, uVar6 <= uVar5) {
        puVar1 = puVar12 + uVar14;
        uVar8 = *puVar1;
        if (uVar8 == uVar6) {
          local_b8._M_head_impl = key_00;
          pVar21 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_b8,&local_121);
          lVar15 = (longdouble)*(double *)((pVar21.first.m_bucket.m_bucket)->m_value + 8);
          local_38 = local_98[uVar14];
          lVar16 = (longdouble)local_38;
          local_58 = SUB108(lVar16,0);
          uStack_50 = (ushort)((unkuint10)lVar16 >> 0x40);
          if ((NAN(local_38)) || ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000)) {
            local_ec = local_ec - lVar15;
            lVar17 = in_ST3;
          }
          else {
            local_104 = lVar16 * lVar16;
            lVar20 = lVar19;
            lVar18 = lVar19;
            lVar17 = lVar19;
            local_110 = lVar15;
            local_8c = lVar16;
            fmal();
            local_f8 = in_ST0;
            fmal();
            in_ST0 = lVar19;
            lVar19 = lVar17;
            local_120 = in_ST1;
            fmal();
            in_ST1 = lVar20;
            local_d0 = in_ST2;
            fmal();
            in_ST2 = lVar18;
            local_c4 = in_ST3;
          }
          puVar12 = local_e0._0_8_;
          lVar15 = local_120;
          if ((key_00 == local_70) || (uVar14 == local_78)) break;
          puVar13 = puVar1 + 1;
          key_00 = key_00 + 1;
          uVar6 = (long)((long)puVar2 + (uVar3 * 8 - (long)puVar13)) >> 3;
          uVar11 = local_b0;
          if (0 < (long)uVar6) {
            do {
              uVar8 = uVar6 >> 1;
              uVar9 = ~uVar8 + uVar6;
              uVar6 = uVar8;
              if (puVar13[uVar8] < *key_00) {
                puVar13 = puVar13 + uVar8 + 1;
                uVar6 = uVar9;
              }
            } while (0 < (long)uVar6);
          }
LAB_001331e3:
          uVar14 = (long)puVar13 - (long)puVar12 >> 3;
          in_ST3 = lVar17;
        }
        else {
          if (uVar8 <= uVar6) {
            puVar13 = puVar1 + 1;
            uVar8 = (long)((long)puVar2 + (uVar3 * 8 - (long)(puVar1 + 1))) >> 3;
            while (lVar17 = in_ST3, 0 < (long)uVar8) {
              uVar9 = uVar8 >> 1;
              uVar10 = ~uVar9 + uVar8;
              uVar8 = uVar9;
              if (puVar13[uVar9] < uVar6) {
                puVar13 = puVar13 + uVar9 + 1;
                uVar8 = uVar10;
              }
            }
            goto LAB_001331e3;
          }
          key_00 = key_00 + 1;
          uVar6 = (long)puVar7 - (long)key_00 >> 3;
          while (0 < (long)uVar6) {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if (key_00[uVar9] < uVar8) {
              key_00 = key_00 + uVar9 + 1;
              uVar6 = uVar10;
            }
          }
        }
        lVar15 = local_120;
        if ((key_00 == puVar7) || (uVar14 == uVar11)) break;
      }
    }
    local_120 = lVar15;
    lVar15 = local_ec;
    if (local_ec <= (longdouble)0) {
      return -INFINITY;
    }
  }
  if ((longdouble)1 < lVar15) {
    if ((local_120 != (longdouble)0) || (NAN(local_120) || NAN((longdouble)0))) {
      if ((local_120 != local_f8 * local_f8) || (NAN(local_120) || NAN(local_f8 * local_f8))) {
        local_110 = local_f8 / lVar15;
        local_104 = local_110 * local_110;
        local_e0 = local_120 / lVar15 - local_104;
        if ((!NAN(local_e0)) &&
           ((local_ec = lVar15, (longdouble)2.220446e-16 < local_e0 ||
            (bVar4 = check_more_than_two_unique_values<double,unsigned_long>
                               (local_a8,local_80,local_a0,local_48,Xc_indptr,puVar12,local_98,
                                missing_action), bVar4)))) {
          if (local_e0 <= (longdouble)0) {
            return 0.0;
          }
          lVar15 = (local_104 * local_110 * local_110 * local_ec +
                   local_f8 * (longdouble)-4.0 * local_104 * local_110 +
                   local_120 * (longdouble)6.0 * local_104 +
                   local_c4 + local_d0 * (longdouble)-4.0 * local_110) /
                   (local_e0 * local_e0 * local_ec);
          local_68 = SUB108(lVar15,0);
          uStack_60 = (ushort)((unkuint10)lVar15 >> 0x40);
          if (((unkuint10)lVar15 & 0x7fff) == 0 ||
              (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
            if ((double)lVar15 <= 0.0) {
              return 0.0;
            }
            return (double)lVar15;
          }
          return -INFINITY;
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}